

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_set_tstamp_precision(pcap_t *p,int tstamp_precision)

{
  int iVar1;
  int local_20;
  int i;
  int tstamp_precision_local;
  pcap_t *p_local;
  
  iVar1 = pcap_check_activated(p);
  if (iVar1 == 0) {
    if (tstamp_precision < 0) {
      p_local._4_4_ = -0xc;
    }
    else {
      if (p->tstamp_precision_count == 0) {
        if (tstamp_precision == 0) {
          (p->opt).tstamp_precision = 0;
          return 0;
        }
      }
      else {
        for (local_20 = 0; local_20 < p->tstamp_precision_count; local_20 = local_20 + 1) {
          if (p->tstamp_precision_list[local_20] == tstamp_precision) {
            (p->opt).tstamp_precision = tstamp_precision;
            return 0;
          }
        }
      }
      p_local._4_4_ = -0xc;
    }
  }
  else {
    p_local._4_4_ = -4;
  }
  return p_local._4_4_;
}

Assistant:

int
pcap_set_tstamp_precision(pcap_t *p, int tstamp_precision)
{
	int i;

	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);

	/*
	 * The argument should have been u_int, but that's too late
	 * to change now - it's an API.
	 */
	if (tstamp_precision < 0)
		return (PCAP_ERROR_TSTAMP_PRECISION_NOTSUP);

	/*
	 * If p->tstamp_precision_count is 0, we only support setting
	 * the time stamp precision to microsecond precision; every
	 * pcap module *MUST* support microsecond precision, even if
	 * it does so by converting the native precision to
	 * microseconds.
	 */
	if (p->tstamp_precision_count == 0) {
		if (tstamp_precision == PCAP_TSTAMP_PRECISION_MICRO) {
			p->opt.tstamp_precision = tstamp_precision;
			return (0);
		}
	} else {
		/*
		 * Check whether we claim to support this precision of
		 * time stamp.
		 */
		for (i = 0; i < p->tstamp_precision_count; i++) {
			if (p->tstamp_precision_list[i] == (u_int)tstamp_precision) {
				/*
				 * Yes.
				 */
				p->opt.tstamp_precision = tstamp_precision;
				return (0);
			}
		}
	}

	/*
	 * We don't support this time stamp precision.
	 */
	return (PCAP_ERROR_TSTAMP_PRECISION_NOTSUP);
}